

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Create(ByteCodeWriter *this)

{
  this->m_functionWrite = (FunctionBody *)0x0;
  this->m_pMatchingNode = (ParseNode *)0x0;
  this->m_matchingNodeRefCount = 0;
  this->isInitialized = false;
  this->isInUse = false;
  this->m_loopNest = 0;
  this->m_byteCodeCount = 0;
  this->m_byteCodeWithoutLDACount = 0;
  this->m_byteCodeInLoopCount = 0;
  this->m_tmpRegCount = 0;
  return;
}

Assistant:

void ByteCodeWriter::Create()
    {
        m_loopNest = 0;
        m_byteCodeCount = 0;
        m_byteCodeWithoutLDACount = 0;
        m_byteCodeInLoopCount = 0;
        m_functionWrite = nullptr;
        m_pMatchingNode = nullptr;
        m_matchingNodeRefCount = 0;
        m_tmpRegCount = 0;
        DebugOnly(isInitialized = false);
        DebugOnly(isInUse = false);
    }